

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O2

void __thiscall
TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test::
~TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test
          (TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ScoringTableTest, DealerWinByDiscard_ManganOrMore)
{
	CHECK_EQUAL(12000, t.dealerWinByDiscard(3, 70));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(4, 40));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(4, 70));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(5, 0));

	CHECK_EQUAL(18000, t.dealerWinByDiscard(6, 0));
	CHECK_EQUAL(18000, t.dealerWinByDiscard(7, 0));

	CHECK_EQUAL(24000, t.dealerWinByDiscard(8, 0));
	CHECK_EQUAL(24000, t.dealerWinByDiscard(9, 0));
	CHECK_EQUAL(24000, t.dealerWinByDiscard(10, 0));

	CHECK_EQUAL(36000, t.dealerWinByDiscard(11, 0));
	CHECK_EQUAL(36000, t.dealerWinByDiscard(12, 0));

	CHECK_EQUAL(48000, t.dealerWinByDiscard(13, 0));
}